

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crosser.cc
# Opt level: O2

int __thiscall S2EdgeCrosser::CrossingSignInternal2(S2EdgeCrosser *this,S2Point *d)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  VType local_60;
  ostream *poStack_58;
  VType local_50;
  Vector3_d c_cross_d;
  
  if (this->have_tangents_ == false) {
    S2::RobustCrossProd((Vector3_d *)&local_60,this->a_,this->b_);
    util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
              (&c_cross_d,(BasicVector<Vector3,_double,_3UL> *)&local_60);
    Vector3<double>::CrossProd(this->a_,&c_cross_d);
    (this->a_tangent_).c_[2] = local_50;
    (this->a_tangent_).c_[0] = local_60;
    (this->a_tangent_).c_[1] = (VType)poStack_58;
    Vector3<double>::CrossProd(&c_cross_d,this->b_);
    (this->b_tangent_).c_[2] = local_50;
    (this->b_tangent_).c_[0] = local_60;
    (this->b_tangent_).c_[1] = (VType)poStack_58;
    this->have_tangents_ = true;
  }
  if ((CrossingSignInternal2(Vector3<double>const&)::kError == '\0') &&
     (iVar5 = __cxa_guard_acquire(&CrossingSignInternal2(Vector3<double>const&)::kError), iVar5 != 0
     )) {
    CrossingSignInternal2::kError = 4.612644198131179e-16;
    __cxa_guard_release(&CrossingSignInternal2(Vector3<double>const&)::kError);
  }
  dVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                    ((BasicVector<Vector3,_double,_3UL> *)this->c_,&this->a_tangent_);
  iVar5 = -1;
  if ((dVar1 <= CrossingSignInternal2::kError) ||
     (dVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                        ((BasicVector<Vector3,_double,_3UL> *)d,&this->a_tangent_),
     dVar1 <= CrossingSignInternal2::kError)) {
    dVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                      ((BasicVector<Vector3,_double,_3UL> *)this->c_,&this->b_tangent_);
    if ((CrossingSignInternal2::kError < dVar1) &&
       (dVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                          ((BasicVector<Vector3,_double,_3UL> *)d,&this->b_tangent_),
       CrossingSignInternal2::kError < dVar1)) {
      return -1;
    }
    bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)this->a_,this->c_);
    if (bVar2) {
      return 0;
    }
    bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)this->a_,d);
    if (bVar2) {
      return 0;
    }
    bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)this->b_,this->c_);
    if (bVar2) {
      return 0;
    }
    bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)this->b_,d);
    if (bVar2) {
      return 0;
    }
    bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)this->a_,this->b_);
    if (bVar2) {
      return -1;
    }
    bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)this->c_,d);
    if (bVar2) {
      return -1;
    }
    iVar4 = this->acb_;
    if (iVar4 == 0) {
      iVar3 = s2pred::ExpensiveSign(this->a_,this->b_,this->c_,true);
      iVar4 = -iVar3;
      this->acb_ = iVar4;
      if (iVar3 == 0) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&c_cross_d,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.cc"
                   ,0x49,kFatal,(ostream *)&std::cerr);
        std::operator<<((ostream *)c_cross_d.c_[1],"Check failed: (acb_) != (0) ");
        goto LAB_0022c161;
      }
    }
    iVar3 = this->bda_;
    if (iVar3 == 0) {
      iVar3 = s2pred::ExpensiveSign(this->a_,this->b_,d,true);
      this->bda_ = iVar3;
      if (iVar3 == 0) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&c_cross_d,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.cc"
                   ,0x4b,kFatal,(ostream *)&std::cerr);
        std::operator<<((ostream *)c_cross_d.c_[1],"Check failed: (bda_) != (0) ");
        goto LAB_0022c161;
      }
      iVar4 = this->acb_;
    }
    if (iVar3 == iVar4) {
      Vector3<double>::CrossProd(this->c_,d);
      iVar5 = s2pred::Sign(this->c_,d,this->b_,&c_cross_d);
      if (iVar5 == 0) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&local_60,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.cc"
                   ,0x50,kFatal,(ostream *)&std::cerr);
        std::operator<<(poStack_58,"Check failed: (cbd) != (0) ");
LAB_0022c161:
        abort();
      }
      if (iVar5 + this->acb_ == 0) {
        iVar5 = s2pred::Sign(this->c_,d,this->a_,&c_cross_d);
        if (iVar5 == 0) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)&local_60,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.cc"
                     ,0x53,kFatal,(ostream *)&std::cerr);
          std::operator<<(poStack_58,"Check failed: (dac) != (0) ");
          goto LAB_0022c161;
        }
        iVar5 = (uint)(iVar5 == this->acb_) * 2 + -1;
      }
      else {
        iVar5 = -1;
      }
    }
  }
  return iVar5;
}

Assistant:

inline int S2EdgeCrosser::CrossingSignInternal2(const S2Point& d) {
  // At this point, a very common situation is that A,B,C,D are four points on
  // a line such that AB does not overlap CD.  (For example, this happens when
  // a line or curve is sampled finely, or when geometry is constructed by
  // computing the union of S2CellIds.)  Most of the time, we can determine
  // that AB and CD do not intersect by computing the two outward-facing
  // tangents at A and B (parallel to AB) and testing whether AB and CD are on
  // opposite sides of the plane perpendicular to one of these tangents.  This
  // is moderately expensive but still much cheaper than s2pred::ExpensiveSign.
  if (!have_tangents_) {
    S2Point norm = S2::RobustCrossProd(*a_, *b_).Normalize();
    a_tangent_ = a_->CrossProd(norm);
    b_tangent_ = norm.CrossProd(*b_);
    have_tangents_ = true;
  }
  // The error in RobustCrossProd() is insignificant.  The maximum error in
  // the call to CrossProd() (i.e., the maximum norm of the error vector) is
  // (0.5 + 1/sqrt(3)) * DBL_EPSILON.  The maximum error in each call to
  // DotProd() below is DBL_EPSILON.  (There is also a small relative error
  // term that is insignificant because we are comparing the result against a
  // constant that is very close to zero.)
  static const double kError = (1.5 + 1/sqrt(3)) * DBL_EPSILON;
  if ((c_->DotProd(a_tangent_) > kError && d.DotProd(a_tangent_) > kError) ||
      (c_->DotProd(b_tangent_) > kError && d.DotProd(b_tangent_) > kError)) {
    return -1;
  }

  // Otherwise, eliminate the cases where two vertices from different edges
  // are equal.  (These cases could be handled in the code below, but we would
  // rather avoid calling ExpensiveSign whenever possible.)
  if (*a_ == *c_ || *a_ == d || *b_ == *c_ || *b_ == d) return 0;

  // Eliminate cases where an input edge is degenerate.  (Note that in most
  // cases, if CD is degenerate then this method is not even called because
  // acb_ and bda have different signs.)
  if (*a_ == *b_ || *c_ == d) return -1;

  // Otherwise it's time to break out the big guns.
  if (acb_ == 0) acb_ = -s2pred::ExpensiveSign(*a_, *b_, *c_);
  S2_DCHECK_NE(acb_, 0);
  if (bda_ == 0) bda_ = s2pred::ExpensiveSign(*a_, *b_, d);
  S2_DCHECK_NE(bda_, 0);
  if (bda_ != acb_) return -1;

  Vector3_d c_cross_d = c_->CrossProd(d);
  int cbd = -s2pred::Sign(*c_, d, *b_, c_cross_d);
  S2_DCHECK_NE(cbd, 0);
  if (cbd != acb_) return -1;
  int dac = s2pred::Sign(*c_, d, *a_, c_cross_d);
  S2_DCHECK_NE(dac, 0);
  return (dac != acb_) ? -1 : 1;
}